

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Curve::readFrom(Curve *this,BinaryReader *binary)

{
  Shape::readFrom(&this->super_Shape,binary);
  BinaryReader::read<float,void>(binary,&this->width0);
  BinaryReader::read<float,void>(binary,&this->width1);
  BinaryReader::read<pbrt::Curve::BasisType,void>(binary,&this->basis);
  BinaryReader::read<pbrt::Curve::CurveType,void>(binary,&this->type);
  BinaryReader::read<unsigned_char,void>(binary,&this->degree);
  BinaryReader::read<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>(binary,&this->P);
  BinaryReader::read<pbrt::math::affine3f,void>(binary,&this->transform);
  return;
}

Assistant:

void Curve::readFrom(BinaryReader &binary) 
  {
    Shape::readFrom(binary);
    binary.read(width0);
    binary.read(width1);
    binary.read(basis);
    binary.read(type);
    binary.read(degree);
    binary.read(P);
    binary.read(transform);
  }